

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

int xmlCatalogSetDebug(int level)

{
  int iVar1;
  int ret;
  int level_local;
  
  iVar1 = xmlDebugCatalogs;
  xmlDebugCatalogs = level;
  if (level < 1) {
    xmlDebugCatalogs = 0;
  }
  return iVar1;
}

Assistant:

int
xmlCatalogSetDebug(int level) {
    int ret = xmlDebugCatalogs;

    if (level <= 0)
        xmlDebugCatalogs = 0;
    else
	xmlDebugCatalogs = level;
    return(ret);
}